

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libauthretry.c
# Opt level: O0

long parse_auth_name(char *arg)

{
  int iVar1;
  char *arg_local;
  
  if (arg == (char *)0x0) {
    arg_local = (char *)0x0;
  }
  else {
    iVar1 = curl_strequal(arg,"basic");
    if (iVar1 == 0) {
      iVar1 = curl_strequal(arg,"digest");
      if (iVar1 == 0) {
        iVar1 = curl_strequal(arg,"ntlm");
        if (iVar1 == 0) {
          arg_local = (char *)0x0;
        }
        else {
          arg_local = (char *)0x8;
        }
      }
      else {
        arg_local = (char *)0x2;
      }
    }
    else {
      arg_local = (char *)0x1;
    }
  }
  return (long)arg_local;
}

Assistant:

static long parse_auth_name(const char *arg)
{
  if(!arg)
    return CURLAUTH_NONE;
  if(curl_strequal(arg, "basic"))
    return CURLAUTH_BASIC;
  if(curl_strequal(arg, "digest"))
    return CURLAUTH_DIGEST;
  if(curl_strequal(arg, "ntlm"))
    return CURLAUTH_NTLM;
  return CURLAUTH_NONE;
}